

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqBroker.cpp
# Opt level: O1

bool __thiscall helics::zeromq::ZmqBroker::brokerConnect(ZmqBroker *this)

{
  bool bVar1;
  string local_30;
  
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  ZmqContextManager::startContext(&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,
                    CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,
                             local_30.field_2._M_local_buf[0]) + 1);
  }
  bVar1 = NetworkBroker<helics::zeromq::ZmqComms,_(gmlc::networking::InterfaceTypes)0,_1>::
          brokerConnect(&this->
                         super_NetworkBroker<helics::zeromq::ZmqComms,_(gmlc::networking::InterfaceTypes)0,_1>
                       );
  return bVar1;
}

Assistant:

bool ZmqBroker::brokerConnect()
    {
        ZmqContextManager::startContext();
        return NetworkBroker::brokerConnect();
    }